

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

int curve_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
               t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  int iVar1;
  _instancetemplate *p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  t_pd f;
  float fVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  t_float tVar11;
  uint local_9c;
  int local_98;
  
  iVar6 = 0;
  if ((((ulong)z[3].g_pd & 0x14) == 0) && (iVar6 = 0, *(char *)&z[0xb].g_pd == '\x01')) {
    iVar1 = *(int *)&z[0xd].g_next;
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar7 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar7 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
    if (0 < iVar1 && fVar7 != 0.0) {
      f = z[0xe].g_pd;
      local_9c = 0x7fffffff;
      local_98 = -1;
      iVar6 = 0;
      do {
        tVar8 = fielddesc_getcoord((_fielddesc *)f,template,data,0);
        tVar9 = glist_xtopixels(glist,(float)(int)tVar8 + basex);
        tVar10 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,0);
        tVar11 = glist_ytopixels(glist,(float)(int)tVar10 + basey);
        if ((*(undefined1 *)((long)&f->c_name + 1) != '\0') ||
           (*(undefined1 *)((long)&f->c_nmethod + 1) != '\0')) {
          uVar4 = (int)tVar9 - xpix;
          uVar5 = (int)tVar11 - ypix;
          uVar3 = -uVar4;
          if (0 < (int)uVar4) {
            uVar3 = uVar4;
          }
          uVar4 = -uVar5;
          if (0 < (int)uVar5) {
            uVar4 = uVar5;
          }
          if (uVar4 <= uVar3) {
            uVar4 = uVar3;
          }
          if ((int)uVar4 < (int)local_9c) {
            p_Var2 = (pd_maininstance.pd_gui)->i_template;
            *(float *)(p_Var2 + 8) = (float)(int)tVar8;
            *(float *)(p_Var2 + 0x14) = (float)(int)tVar10;
            local_9c = uVar4;
            local_98 = iVar6;
          }
        }
        iVar6 = iVar6 + 1;
        f = (t_pd)&f->c_symbolmethod;
      } while (iVar1 != iVar6);
      iVar6 = 0;
      if (((int)local_9c < 7) && (iVar6 = 1, doit != 0)) {
        tVar8 = glist_pixelstox(glist,1.0);
        tVar9 = glist_pixelstox(glist,0.0);
        *(float *)((pd_maininstance.pd_gui)->i_template + 0xc) = tVar8 - tVar9;
        tVar8 = glist_pixelstoy(glist,1.0);
        tVar9 = glist_pixelstoy(glist,0.0);
        p_Var2 = (pd_maininstance.pd_gui)->i_template;
        *(float *)(p_Var2 + 0x18) = tVar8 - tVar9;
        *(int *)(p_Var2 + 4) = 0;
        *(int *)(p_Var2 + 0x10) = 0;
        *(_glist **)(p_Var2 + 0x20) = glist;
        *(t_scalar **)(p_Var2 + 0x28) = sc;
        *(_array **)(p_Var2 + 0x30) = ap;
        *(t_word **)(p_Var2 + 0x38) = data;
        *(int *)p_Var2 = local_98 * 2;
        *(t_template **)(p_Var2 + 0x40) = template;
        if (sc == (t_scalar *)0x0) {
          gpointer_setarray((t_gpointer *)(p_Var2 + 0x48),ap,data);
        }
        else {
          gpointer_setglist((t_gpointer *)(p_Var2 + 0x48),glist,sc);
        }
        glist_grab(glist,z,curve_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
      }
    }
  }
  return iVar6;
}

Assistant:

static int curve_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    int bestn = -1;
    int besterror = 0x7fffffff;
    t_fielddesc *f;
    if ((x->x_flags & NOMOUSERUN) || (x->x_flags & NOVERTICES) ||
        !fielddesc_getfloat(&x->x_vis, template, data, 0))
            return (0);
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xval = fielddesc_getcoord(f, template, data, 0),
            xloc = glist_xtopixels(glist, basex + xval);
        int yval = fielddesc_getcoord(f+1, template, data, 0),
            yloc = glist_ytopixels(glist, basey + yval);
        int xerr = xloc - xpix, yerr = yloc - ypix;
        if (!f->fd_var && !(f+1)->fd_var)
            continue;
        if (xerr < 0)
            xerr = -xerr;
        if (yerr < 0)
            yerr = -yerr;
        if (yerr > xerr)
            xerr = yerr;
        if (xerr < besterror)
        {
            TEMPLATE->curve_motion_xbase = xval;
            TEMPLATE->curve_motion_ybase = yval;
            besterror = xerr;
            bestn = i;
        }
    }
    if (besterror > 6)
        return (0);
    if (doit)
    {
        TEMPLATE->curve_motion_xper = glist_pixelstox(glist, 1)
            - glist_pixelstox(glist, 0);
        TEMPLATE->curve_motion_yper = glist_pixelstoy(glist, 1)
            - glist_pixelstoy(glist, 0);
        TEMPLATE->curve_motion_xcumulative = 0;
        TEMPLATE->curve_motion_ycumulative = 0;
        TEMPLATE->curve_motion_glist = glist;
        TEMPLATE->curve_motion_scalar = sc;
        TEMPLATE->curve_motion_array = ap;
        TEMPLATE->curve_motion_wp = data;
        TEMPLATE->curve_motion_field = 2*bestn;
        TEMPLATE->curve_motion_template = template;
        if (TEMPLATE->curve_motion_scalar)
            gpointer_setglist(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_glist, TEMPLATE->curve_motion_scalar);
        else gpointer_setarray(&TEMPLATE->curve_motion_gpointer,
                TEMPLATE->curve_motion_array, TEMPLATE->curve_motion_wp);
        glist_grab(glist, z, curve_motionfn, 0, xpix, ypix);
    }
    return (1);
}